

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::ItemInputable(ImGuiWindow_conflict *window,ImGuiID id)

{
  byte *pbVar1;
  uint uVar2;
  ImGuiContext_conflict1 *pIVar3;
  int iVar4;
  
  pIVar3 = GImGui;
  if ((id == 0) || ((GImGui->LastItemData).ID != id)) {
    __assert_fail("id != 0 && id == g.LastItemData.ID",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                  ,0xd25,"void ImGui::ItemInputable(ImGuiWindow *, ImGuiID)");
  }
  uVar2 = (GImGui->LastItemData).InFlags;
  if ((uVar2 & 5) == 0) {
    iVar4 = (window->DC).FocusCounterTabStop + 1;
    (window->DC).FocusCounterTabStop = iVar4;
    if (pIVar3->NavId == id) {
      pIVar3->NavIdTabCounter = iVar4;
    }
  }
  if (((pIVar3->ActiveId == id) && (pIVar3->TabFocusPressed == true)) &&
     (pIVar3->TabFocusRequestNextWindow == (ImGuiWindow_conflict *)0x0)) {
    pIVar3->TabFocusRequestNextWindow = window;
    iVar4 = 1;
    if ((pIVar3->IO).KeyShift != false) {
      iVar4 = -(uint)((uVar2 & 5) == 0);
    }
    pIVar3->TabFocusRequestNextCounterTabStop = iVar4 + (window->DC).FocusCounterTabStop;
  }
  if (pIVar3->TabFocusRequestCurrWindow == window) {
    if (((uVar2 & 5) == 0) &&
       ((window->DC).FocusCounterTabStop == pIVar3->TabFocusRequestCurrCounterTabStop)) {
      pIVar3->NavJustTabbedId = id;
      pbVar1 = (byte *)((long)&(pIVar3->LastItemData).StatusFlags + 1);
      *pbVar1 = *pbVar1 | 1;
      return;
    }
    if (pIVar3->ActiveId == id) {
      SetActiveID(0,(ImGuiWindow_conflict *)0x0);
      return;
    }
  }
  return;
}

Assistant:

void ImGui::ItemInputable(ImGuiWindow* window, ImGuiID id)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(id != 0 && id == g.LastItemData.ID);

    // Increment counters
    // FIXME: ImGuiItemFlags_Disabled should disable more.
    const bool is_tab_stop = (g.LastItemData.InFlags & (ImGuiItemFlags_NoTabStop | ImGuiItemFlags_Disabled)) == 0;
    if (is_tab_stop)
    {
        window->DC.FocusCounterTabStop++;
        if (g.NavId == id)
            g.NavIdTabCounter = window->DC.FocusCounterTabStop;
    }

    // Process TAB/Shift-TAB to tab *OUT* of the currently focused item.
    // (Note that we can always TAB out of a widget that doesn't allow tabbing in)
    if (g.ActiveId == id && g.TabFocusPressed && g.TabFocusRequestNextWindow == NULL)
    {
        g.TabFocusRequestNextWindow = window;
        g.TabFocusRequestNextCounterTabStop = window->DC.FocusCounterTabStop + (g.IO.KeyShift ? (is_tab_stop ? -1 : 0) : +1); // Modulo on index will be applied at the end of frame once we've got the total counter of items.
    }

    // Handle focus requests
    if (g.TabFocusRequestCurrWindow == window)
    {
        if (is_tab_stop && window->DC.FocusCounterTabStop == g.TabFocusRequestCurrCounterTabStop)
        {
            g.NavJustTabbedId = id; // FIXME-NAV: aim to eventually set in NavUpdate() once we finish the refactor
            g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_FocusedByTabbing;
            return;
        }

        // If another item is about to be focused, we clear our own active id
        if (g.ActiveId == id)
            ClearActiveID();
    }
}